

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O1

lyd_node * lyd_parse_data_(ly_ctx *ctx,char *data,LYD_FORMAT format,int options,__va_list_tag *ap)

{
  lyd_node **pplVar1;
  uint uVar2;
  lyd_node *plVar3;
  int iVar4;
  lyxml_elem *in_RAX;
  LY_ERR *pLVar5;
  long *plVar6;
  lyd_node *plVar7;
  lyd_node *plVar8;
  char *pcVar9;
  char *format_00;
  lyxml_elem *local_38;
  
  local_38 = in_RAX;
  iVar4 = lyp_check_options(options);
  if (iVar4 != 0) {
    pLVar5 = ly_errno_location();
    *pLVar5 = LY_EINVAL;
    format_00 = "%s: Invalid options (multiple data type flags set).";
LAB_0015c77a:
    pcVar9 = "lyd_parse_data_";
    goto LAB_0015c781;
  }
  if ((options & 0x20U) == 0) {
    plVar7 = (lyd_node *)0x0;
  }
  else {
    uVar2 = ap->gp_offset;
    if ((ulong)uVar2 < 0x29) {
      plVar6 = (long *)((ulong)uVar2 + (long)ap->reg_save_area);
      ap->gp_offset = uVar2 + 8;
    }
    else {
      plVar6 = (long *)ap->overflow_arg_area;
      ap->overflow_arg_area = plVar6 + 1;
    }
    plVar7 = (lyd_node *)*plVar6;
    if (((plVar7 == (lyd_node *)0x0) || (plVar7->parent != (lyd_node *)0x0)) ||
       ((plVar7->schema->nodetype & (LYS_RPC|LYS_LIST|LYS_CONTAINER)) == LYS_UNKNOWN)) {
      pLVar5 = ly_errno_location();
      *pLVar5 = LY_EINVAL;
      format_00 = "%s: invalid variable parameter (const struct lyd_node *rpc_act).";
      goto LAB_0015c77a;
    }
  }
  if ((options & 0x70U) == 0) {
LAB_0015c6b8:
    plVar8 = (lyd_node *)0x0;
  }
  else {
    uVar2 = ap->gp_offset;
    if ((ulong)uVar2 < 0x29) {
      plVar6 = (long *)((ulong)uVar2 + (long)ap->reg_save_area);
      ap->gp_offset = uVar2 + 8;
    }
    else {
      plVar6 = (long *)ap->overflow_arg_area;
      ap->overflow_arg_area = plVar6 + 1;
    }
    plVar3 = (lyd_node *)*plVar6;
    plVar8 = plVar3;
    if (plVar3 == (lyd_node *)0x0) goto LAB_0015c6b8;
    do {
      if (plVar8->parent != (lyd_node *)0x0) {
        pLVar5 = ly_errno_location();
        *pLVar5 = LY_EINVAL;
        format_00 = "%s: invalid variable parameter (const struct lyd_node *data_tree).";
        goto LAB_0015c77a;
      }
      pplVar1 = &plVar8->next;
      plVar8 = *pplVar1;
    } while (*pplVar1 != (lyd_node *)0x0);
    do {
      plVar8 = plVar3;
      plVar3 = plVar8->prev;
    } while (plVar8->prev->next != (lyd_node *)0x0);
    if (((uint)options >> 0xc & 1) != 0) {
      pLVar5 = ly_errno_location();
      *pLVar5 = LY_EINVAL;
      format_00 = 
      "%s: invalid parameter (variable arg const struct lyd_node *data_tree with LYD_OPT_NOSIBLINGS)."
      ;
      goto LAB_0015c77a;
    }
  }
  if (ctx != (ly_ctx *)0x0 && data != (char *)0x0) {
    if (format == LYD_JSON) {
      plVar7 = lyd_parse_json(ctx,data,options,plVar7,plVar8);
    }
    else {
      if (format != LYD_XML) {
        return (lyd_node *)0x0;
      }
      local_38 = lyxml_parse_mem(ctx,data,(uint)(((uint)options >> 0xc & 1) == 0));
      pLVar5 = ly_errno_location();
      if (*pLVar5 != LY_SUCCESS) {
        return (lyd_node *)0x0;
      }
      if ((options & 0x20U) == 0) {
        if ((options & 0x50U) == 0) {
          plVar7 = lyd_parse_xml(ctx,&local_38,options);
        }
        else {
          plVar7 = lyd_parse_xml(ctx,&local_38,options,plVar8);
        }
      }
      else {
        plVar7 = lyd_parse_xml(ctx,&local_38,options,plVar7,plVar8);
      }
      lyxml_free_withsiblings(ctx,local_38);
    }
    pLVar5 = ly_errno_location();
    if (*pLVar5 != LY_SUCCESS) {
      lyd_free_withsiblings(plVar7);
      return (lyd_node *)0x0;
    }
    return plVar7;
  }
  pLVar5 = ly_errno_location();
  *pLVar5 = LY_EINVAL;
  format_00 = "%s: Invalid parameter.";
  pcVar9 = "lyd_parse_";
LAB_0015c781:
  ly_log(LY_LLERR,format_00,pcVar9);
  return (lyd_node *)0x0;
}

Assistant:

static struct lyd_node *
lyd_parse_data_(struct ly_ctx *ctx, const char *data, LYD_FORMAT format, int options, va_list ap)
{
    const struct lyd_node *rpc_act = NULL, *data_tree = NULL, *iter;

    if (lyp_check_options(options)) {
        LOGERR(LY_EINVAL, "%s: Invalid options (multiple data type flags set).", __func__);
        return NULL;
    }

    if (options & LYD_OPT_RPCREPLY) {
        rpc_act = va_arg(ap, const struct lyd_node *);
        if (!rpc_act || rpc_act->parent || !(rpc_act->schema->nodetype & (LYS_RPC | LYS_LIST | LYS_CONTAINER))) {
            LOGERR(LY_EINVAL, "%s: invalid variable parameter (const struct lyd_node *rpc_act).", __func__);
            return NULL;
        }
    }
    if (options & (LYD_OPT_RPC | LYD_OPT_NOTIF | LYD_OPT_RPCREPLY)) {
        data_tree = va_arg(ap, const struct lyd_node *);
        if (data_tree) {
            LY_TREE_FOR(data_tree, iter) {
                if (iter->parent) {
                    /* a sibling is not top-level */
                    LOGERR(LY_EINVAL, "%s: invalid variable parameter (const struct lyd_node *data_tree).", __func__);
                    return NULL;
                }
            }

            /* move it to the beginning */
            for (; data_tree->prev->next; data_tree = data_tree->prev);

            /* LYD_OPT_NOSIBLINGS cannot be set in this case */
            if (options & LYD_OPT_NOSIBLINGS) {
                LOGERR(LY_EINVAL, "%s: invalid parameter (variable arg const struct lyd_node *data_tree with LYD_OPT_NOSIBLINGS).", __func__);
                return NULL;
            }
        }
    }

    return lyd_parse_(ctx, rpc_act, data, format, options, data_tree);
}